

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanFlowCollectionEnd(Scanner *this,bool IsSequence)

{
  StringRef local_60;
  undefined1 local_50 [8];
  Token T;
  bool IsSequence_local;
  Scanner *this_local;
  
  T.Value.field_2._M_local_buf[0xf] = IsSequence;
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = false;
  Token::Token((Token *)local_50);
  local_50._0_4_ = ((byte)~T.Value.field_2._M_local_buf[0xf] & 1) * 2 + TK_FlowSequenceEnd;
  StringRef::StringRef(&local_60,this->Current,1);
  T._0_8_ = local_60.Data;
  T.Range.Data = (char *)local_60.Length;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_50);
  if (this->FlowLevel != 0) {
    this->FlowLevel = this->FlowLevel - 1;
  }
  Token::~Token((Token *)local_50);
  return true;
}

Assistant:

bool Scanner::scanFlowCollectionEnd(bool IsSequence) {
  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = false;
  Token T;
  T.Kind = IsSequence ? Token::TK_FlowSequenceEnd
                      : Token::TK_FlowMappingEnd;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  if (FlowLevel)
    --FlowLevel;
  return true;
}